

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

BUFFER_HANDLE BUFFER_clone(BUFFER_HANDLE handle)

{
  int iVar1;
  BUFFER *handleptr;
  LOGGER_LOG p_Var2;
  
  if ((handle != (BUFFER_HANDLE)0x0) &&
     (handleptr = (BUFFER *)calloc(1,0x10), handleptr != (BUFFER *)0x0)) {
    iVar1 = BUFFER_safemalloc(handleptr,handle->size);
    if (iVar1 == 0) {
      memcpy(handleptr->buffer,handle->buffer,handle->size);
      handleptr->size = handle->size;
      return handleptr;
    }
    free(handleptr);
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                ,"BUFFER_clone",0x29e,1,"Failure: allocating temp buffer.");
      return (BUFFER_HANDLE)0x0;
    }
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE BUFFER_clone(BUFFER_HANDLE handle)
{
    BUFFER_HANDLE result;
    if (handle == NULL)
    {
        result = NULL;
    }
    else
    {
        BUFFER* suppliedBuff = (BUFFER*)handle;
        BUFFER* b = (BUFFER*)calloc(1, sizeof(BUFFER));
        if (b != NULL)
        {
            if (BUFFER_safemalloc(b, suppliedBuff->size) != 0)
            {
                free(b);
                LogError("Failure: allocating temp buffer.");
                result = NULL;
            }
            else
            {
                (void)memcpy(b->buffer, suppliedBuff->buffer, suppliedBuff->size);
                b->size = suppliedBuff->size;
                result = (BUFFER_HANDLE)b;
            }
        }
        else
        {
            result = NULL;
        }
    }
    return result;
}